

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O3

void tcg_gen_dup64i_vec_aarch64(TCGContext_conflict1 *tcg_ctx,TCGv_vec r,uint64_t a)

{
  uint uVar1;
  TCGOp *pTVar2;
  
  uVar1 = *(uint *)(r + (long)&tcg_ctx->pool_cur);
  pTVar2 = tcg_emit_op_aarch64(tcg_ctx,INDEX_op_dupi_vec);
  *(uint *)pTVar2 = (*(uint *)pTVar2 & 0xffff00ff) + ((uVar1 >> 8) + 0xe00 & 0xf00) + 0x3000;
  pTVar2->args[0] = (TCGArg)(r + (long)&tcg_ctx->pool_cur);
  pTVar2->args[1] = a;
  return;
}

Assistant:

void tcg_gen_dup64i_vec(TCGContext *tcg_ctx, TCGv_vec r, uint64_t a)
{
    if (TCG_TARGET_REG_BITS == 32 && a == deposit64(a, 32, 32, a)) {
        do_dupi_vec(tcg_ctx, r, MO_32, a);
    } else if (TCG_TARGET_REG_BITS == 64 || a == (uint64_t)(int32_t)a) {
        do_dupi_vec(tcg_ctx, r, MO_64, a);
    } else {
        TCGv_i64 c = tcg_const_i64(tcg_ctx, a);
        tcg_gen_dup_i64_vec(tcg_ctx, MO_64, r, c);
        tcg_temp_free_i64(tcg_ctx, c);
    }
}